

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCAEngine.h
# Opt level: O0

void __thiscall
Js::SCAEngine<unsigned_int,_void_*,_Js::DeserializationCloner<Js::StreamReader>_>::Clone
          (SCAEngine<unsigned_int,_void_*,_Js::DeserializationCloner<Js::StreamReader>_> *this,
          uint src,void **dst)

{
  bool bVar1;
  ScriptContext *pSVar2;
  ThreadContext *this_00;
  SCADeepCloneType local_28;
  SrcTypeId local_24;
  SCADeepCloneType deepClone;
  SrcTypeId typeId;
  void **dst_local;
  SCAEngine<unsigned_int,_void_*,_Js::DeserializationCloner<Js::StreamReader>_> *pSStack_10;
  uint src_local;
  SCAEngine<unsigned_int,_void_*,_Js::DeserializationCloner<Js::StreamReader>_> *this_local;
  
  _deepClone = dst;
  dst_local._4_4_ = src;
  pSStack_10 = this;
  pSVar2 = ScriptContextHolder::GetScriptContext((ScriptContextHolder *)this->m_cloner);
  this_00 = ScriptContext::GetThreadContext(pSVar2);
  pSVar2 = ScriptContextHolder::GetScriptContext((ScriptContextHolder *)this->m_cloner);
  ThreadContext::ProbeStack(this_00,0xc00,pSVar2,(PVOID)0x0);
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<unsigned_int>(dst_local._4_4_);
  local_24 = DeserializationCloner<Js::StreamReader>::GetTypeId(this->m_cloner,dst_local._4_4_);
  bVar1 = DeserializationCloner<Js::StreamReader>::TryClonePrimitive
                    (this->m_cloner,local_24,dst_local._4_4_,_deepClone);
  if (!bVar1) {
    bVar1 = DeserializationCloner<Js::StreamReader>::ShouldLookupReference();
    if ((bVar1) && (bVar1 = TryGetClonedObject(this,dst_local._4_4_,_deepClone), bVar1)) {
      DeserializationCloner<Js::StreamReader>::CloneObjectReference
                (this->m_cloner,dst_local._4_4_,*_deepClone);
    }
    else {
      bVar1 = DeserializationCloner<Js::StreamReader>::TryCloneObject
                        (this->m_cloner,local_24,dst_local._4_4_,_deepClone,&local_28);
      if (bVar1) {
        JsUtil::
        BaseDictionary<unsigned_int,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        ::Add(this->m_clonedObjects,(uint *)((long)&dst_local + 4),_deepClone);
        if (local_28 == Map) {
          DeserializationCloner<Js::StreamReader>::CloneMap
                    (this->m_cloner,dst_local._4_4_,*_deepClone);
          local_28 = Object;
        }
        else if (local_28 == Set) {
          DeserializationCloner<Js::StreamReader>::CloneSet
                    (this->m_cloner,dst_local._4_4_,*_deepClone);
          local_28 = Object;
        }
        if (local_28 == HostObject) {
          DeserializationCloner<Js::StreamReader>::CloneHostObjectProperties
                    (this->m_cloner,local_24,dst_local._4_4_,*_deepClone);
        }
        else if (local_28 == Object) {
          DeserializationCloner<Js::StreamReader>::CloneProperties
                    (this->m_cloner,local_24,dst_local._4_4_,*_deepClone);
        }
      }
      else {
        DeserializationCloner<Js::StreamReader>::ThrowSCAUnsupported(this->m_cloner);
      }
    }
  }
  return;
}

Assistant:

void Clone(Src src, Dst* dst)
        {
            PROBE_STACK(m_cloner->GetScriptContext(), Constants::MinStackDefault);

#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Src>(src);
#endif

            typename Cloner::SrcTypeId typeId = m_cloner->GetTypeId(src);

            if (m_cloner->TryClonePrimitive(typeId, src, dst))
            {
                return;
            }

            if (Cloner::ShouldLookupReference() && TryGetClonedObject(src, dst))
            {
                m_cloner->CloneObjectReference(src, *dst);
                return;
            }

            SCADeepCloneType deepClone;
            if (m_cloner->TryCloneObject(typeId, src, dst, &deepClone))
            {
                m_clonedObjects->Add(src, *dst);

                if (deepClone == SCADeepCloneType::Map)
                {
                    m_cloner->CloneMap(src, *dst);
                    deepClone = SCADeepCloneType::Object;
                }
                else if (deepClone == SCADeepCloneType::Set)
                {
                    m_cloner->CloneSet(src, *dst);
                    deepClone = SCADeepCloneType::Object;
                }

                if (deepClone == SCADeepCloneType::HostObject)
                {
                    m_cloner->CloneHostObjectProperties(typeId, src, *dst);
                }
                else if (deepClone == SCADeepCloneType::Object)
                {
                    m_cloner->CloneProperties(typeId, src, *dst);
                }
                return;
            }

            // Unsupported src type, throw
            m_cloner->ThrowSCAUnsupported();
        }